

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O1

ResultValue * __thiscall
Operator::apply(ResultValue *__return_storage_ptr__,Operator *this,ResultValue lhs,ResultValue rhs)

{
  runtime_error *this_00;
  ResultValue local_68;
  ResultValue local_38;
  
  if (this->mIsUnary == true) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Not a binary operator.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_68.mComplexValue._M_value._8_8_ = lhs.mComplexValue._M_value._8_8_;
  local_68.mFloatValue = lhs.mFloatValue;
  local_68.mComplexValue._M_value._0_8_ = lhs.mComplexValue._M_value._0_8_;
  local_68.mType = lhs.mType;
  local_68._4_4_ = lhs._4_4_;
  local_68.mIntValue = lhs.mIntValue;
  local_38.mComplexValue._M_value._8_8_ = rhs.mComplexValue._M_value._8_8_;
  local_38.mFloatValue._0_4_ = rhs.mFloatValue._0_4_;
  local_38.mFloatValue._4_4_ = rhs.mFloatValue._4_4_;
  local_38.mComplexValue._M_value._0_4_ = rhs.mComplexValue._M_value._0_4_;
  local_38.mComplexValue._M_value._4_4_ = rhs.mComplexValue._M_value._4_4_;
  local_38.mType = rhs.mType;
  local_38._4_4_ = rhs._4_4_;
  local_38.mIntValue._0_4_ = (undefined4)rhs.mIntValue;
  local_38.mIntValue._4_4_ = rhs.mIntValue._4_4_;
  if ((this->mBinaryFn).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->mBinaryFn)._M_invoker)
              (__return_storage_ptr__,(_Any_data *)&this->mBinaryFn,&local_68,&local_38);
    return __return_storage_ptr__;
  }
  std::__throw_bad_function_call();
}

Assistant:

ResultValue Operator::apply(ResultValue lhs, ResultValue rhs) const {
	if (mIsUnary) {
		throw std::runtime_error("Not a binary operator.");
	}

	return mBinaryFn(lhs, rhs);
}